

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O3

void anon_unknown.dwarf_96cd::GetOpenFileDescriptors
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *open_fds)

{
  int iVar1;
  int iVar2;
  int *y;
  Tester *this;
  __hashtable *__h;
  rlimit fd_rlimit;
  int local_1ec;
  rlimit local_1e8;
  int local_1d4;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_1d0;
  char *local_1c8;
  int local_1c0;
  stringstream local_1b8 [392];
  
  local_1d0 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
              CONCAT71(local_1d0._1_7_,1);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix_test.cc"
  ;
  local_1c0 = 0x51;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1ec = 0;
  local_1d4 = getrlimit(RLIMIT_NOFILE,&local_1e8);
  leveldb::test::Tester::IsEq<int,int>((Tester *)&local_1d0,&local_1ec,&local_1d4);
  leveldb::test::Tester::~Tester((Tester *)&local_1d0);
  iVar1 = (int)local_1e8.rlim_cur;
  local_1e8.rlim_cur._0_4_ = 0;
  if (0 < iVar1) {
    do {
      iVar2 = dup2((int)local_1e8.rlim_cur,(int)local_1e8.rlim_cur);
      if (iVar2 == (int)local_1e8.rlim_cur) {
        local_1d0 = open_fds;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)open_fds,&local_1e8,(Tester *)&local_1d0);
      }
      else {
        local_1d0 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    CONCAT71(local_1d0._1_7_,1);
        local_1c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix_test.cc"
        ;
        local_1c0 = 0x62;
        std::__cxx11::stringstream::stringstream(local_1b8);
        local_1ec = 9;
        y = __errno_location();
        this = leveldb::test::Tester::IsEq<int,int>((Tester *)&local_1d0,&local_1ec,y);
        leveldb::test::Tester::operator<<
                  (this,(char (*) [60])"dup2() should set errno to EBADF on closed file descriptors"
                  );
        leveldb::test::Tester::~Tester((Tester *)&local_1d0);
      }
      local_1e8.rlim_cur._0_4_ = (int)local_1e8.rlim_cur + 1;
    } while ((int)local_1e8.rlim_cur < iVar1);
  }
  return;
}

Assistant:

void GetOpenFileDescriptors(std::unordered_set<int>* open_fds) {
  int max_fd = 0;
  GetMaxFileDescriptor(&max_fd);

  for (int fd = 0; fd < max_fd; ++fd) {
    if (::dup2(fd, fd) != fd) {
      // When given the same file descriptor twice, dup2() returns -1 if the
      // file descriptor is closed, or the given file descriptor if it is open.
      //
      // Double-check that dup2() is saying the fd is closed.
      ASSERT_EQ(EBADF, errno)
          << "dup2() should set errno to EBADF on closed file descriptors";
      continue;
    }
    open_fds->insert(fd);
  }
}